

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  uint uVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  float fVar5;
  
  uVar4 = (uint)CONCAT62(in_register_00000032,dst);
  uVar1 = (this->IndexLookup).Size;
  if (uVar4 < uVar1) {
    if ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst) {
      return;
    }
    GrowIndex(this,uVar4 + 1);
    if (uVar1 <= src) {
      (this->IndexLookup).Data[dst] = 0xffff;
      pfVar3 = (this->IndexAdvanceX).Data;
      fVar5 = 1.0;
      goto LAB_001f47dc;
    }
  }
  else {
    if (uVar1 <= src) {
      return;
    }
    GrowIndex(this,uVar4 + 1);
  }
  puVar2 = (this->IndexLookup).Data;
  puVar2[dst] = puVar2[src];
  pfVar3 = (this->IndexAdvanceX).Data;
  fVar5 = pfVar3[src];
LAB_001f47dc:
  pfVar3[dst] = fVar5;
  return;
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    unsigned int index_size = (unsigned int)IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (ImWchar)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (ImWchar)-1;
    IndexAdvanceX[dst] = (src < index_size) ? IndexAdvanceX.Data[src] : 1.0f;
}